

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O1

void __thiscall
HEkkDualRow::debugReportBfrtVar
          (HEkkDualRow *this,HighsInt ix,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pass_workData)

{
  double dVar1;
  int iVar2;
  pointer ppVar3;
  HEkk *pHVar4;
  
  if (-1 < ix) {
    ppVar3 = (pass_workData->
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = ppVar3[(uint)ix].first;
    pHVar4 = this->ekk_instance_;
    dVar1 = ppVar3[(uint)ix].second;
    printf("%2d %4d %2d %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %3d\n",
           (pHVar4->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar2],
           (pHVar4->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar2],
           (pHVar4->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar2],dVar1,this->workDual[iVar2],
           ABS(this->workDual[iVar2] / dVar1));
    return;
  }
  puts(
      "Ix iCol Mv       Lower      Primal       Upper       Value        Dual       Ratio      NwDual Ifs"
      );
  return;
}

Assistant:

void HEkkDualRow::debugReportBfrtVar(
    const HighsInt ix,
    const std::vector<std::pair<HighsInt, double>>& pass_workData) const {
  if (ix < 0) {
    printf(
        "Ix iCol Mv       Lower      Primal       Upper       Value        "
        "Dual       Ratio      NwDual Ifs\n");
    return;
  }
  const HighsInt move_out = workDelta < 0 ? -1 : 1;
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  const HighsInt iCol = pass_workData[ix].first;
  const double value = pass_workData[ix].second;
  const HighsInt move = workMove[iCol];
  const double dual = workDual[iCol];
  const double new_dual = dual - move_out * move * workTheta * value;
  const double new_dual_infeasibility = move * new_dual;
  const bool infeasible = new_dual_infeasibility < -Td;
  printf("%2d %4d %2d %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %11.4g %3d\n",
         (int)ix, (int)iCol, (int)move, ekk_instance_.info_.workLower_[iCol],
         ekk_instance_.info_.workValue_[iCol],
         ekk_instance_.info_.workUpper_[iCol], value, dual, fabs(dual / value),
         new_dual, infeasible);
}